

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

search_site_config *
av1_get_first_pass_search_site_config(AV1_COMP *cpi,MACROBLOCK *x,SEARCH_METHODS search_method)

{
  int iVar1;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  MotionVectorSearchParams *mv_search_params;
  int ref_stride;
  undefined3 in_stack_ffffffffffffffe4;
  search_site_config *local_8;
  
  iVar1 = *(int *)(in_RSI + 0x1f8);
  if (iVar1 == *(int *)(in_RDI + 0x6c81c)) {
    local_8 = (search_site_config *)(in_RDI + 0x6bbb8);
  }
  else {
    if (iVar1 != *(int *)(in_RSI + (ulong)""[in_DL] * 0xc68 + 0x20358)) {
      av1_refresh_search_site_config
                ((search_site_config *)CONCAT44(CONCAT13(""[in_DL],in_stack_ffffffffffffffe4),iVar1)
                 ,(SEARCH_METHODS)((ulong)(in_RDI + 0x60df8) >> 0x38),(int)(in_RDI + 0x60df8));
    }
    local_8 = (search_site_config *)(in_RSI + 0x1f6f4);
  }
  return local_8;
}

Assistant:

static inline const search_site_config *av1_get_first_pass_search_site_config(
    const AV1_COMP *cpi, MACROBLOCK *x, SEARCH_METHODS search_method) {
  const int ref_stride = x->e_mbd.plane[0].pre[0].stride;

  // For AVIF applications, even the source frames can have changing resolution,
  // so we need to manually check for the strides :(
  // AV1_COMP::mv_search_params.search_site_config is a compressor level cache
  // that's shared by multiple threads. In most cases where all frames have the
  // same resolution, the cache contains the search site config that we need.
  const MotionVectorSearchParams *mv_search_params = &cpi->mv_search_params;
  if (ref_stride == mv_search_params->search_site_cfg[SS_CFG_FPF]->stride) {
    return mv_search_params->search_site_cfg[SS_CFG_FPF];
  }

  // If the cache does not contain the correct stride, then we will need to rely
  // on the thread level config MACROBLOCK::search_site_cfg_buf. If even the
  // thread level config doesn't match, then we need to update it.
  search_method = search_method_lookup[search_method];
  assert(search_method_lookup[search_method] == search_method &&
         "The search_method_lookup table should be idempotent.");
  if (ref_stride != x->search_site_cfg_buf[search_method].stride) {
    av1_refresh_search_site_config(x->search_site_cfg_buf, search_method,
                                   ref_stride);
  }

  return x->search_site_cfg_buf;
}